

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderPixelEllipsis(ImDrawList *draw_list,ImVec2 pos,int count,ImU32 col)

{
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  float _y;
  float in_XMM0_Db;
  int dot_n;
  ImFont *font;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  ImVec2 *in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd8;
  int iVar1;
  ImDrawList *this;
  
  this = *(ImDrawList **)(*(long *)(in_RDI + 0x38) + 8);
  _y = (float)(int)((*(float *)((long)&(this->CmdBuffer).Data + 4) +
                     (float)(this->_ClipRectStack).Size + 0.5) - 1.0) + in_XMM0_Db;
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd4,(float)iVar1 + (float)iVar1 + in_XMM0_Da,_y);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,(float)iVar1 + (float)iVar1 + in_XMM0_Da + 1.0
                   ,_y + 1.0);
    ImDrawList::AddRectFilled
              (this,(ImVec2 *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
               (ImU32)in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
               (int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void ImGui::RenderPixelEllipsis(ImDrawList* draw_list, ImVec2 pos, int count, ImU32 col)
{
    ImFont* font = draw_list->_Data->Font;
    pos.y += (float)(int)(font->DisplayOffset.y + font->Ascent + 0.5f - 1.0f);
    for (int dot_n = 0; dot_n < count; dot_n++)
        draw_list->AddRectFilled(ImVec2(pos.x + dot_n * 2.0f, pos.y), ImVec2(pos.x + dot_n * 2.0f + 1.0f, pos.y + 1.0f), col);
}